

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O2

uint32_t __thiscall kratos::PackedStruct::bitwidth(PackedStruct *this)

{
  PackedStructFieldDef *pPVar1;
  uint32_t uVar2;
  PackedStructFieldDef *def;
  PackedStructFieldDef *this_00;
  uint32_t uVar3;
  
  pPVar1 = (this->attributes).
           super__Vector_base<kratos::PackedStructFieldDef,_std::allocator<kratos::PackedStructFieldDef>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  uVar3 = 0;
  for (this_00 = (this->attributes).
                 super__Vector_base<kratos::PackedStructFieldDef,_std::allocator<kratos::PackedStructFieldDef>_>
                 ._M_impl.super__Vector_impl_data._M_start; this_00 != pPVar1; this_00 = this_00 + 1
      ) {
    uVar2 = PackedStructFieldDef::bitwidth(this_00);
    uVar3 = uVar3 + uVar2;
  }
  return uVar3;
}

Assistant:

uint32_t PackedStruct::bitwidth() const {
    uint32_t result = 0;
    for (auto const &def : attributes) {
        result += def.bitwidth();
    }
    return result;
}